

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

void testing::internal::TuplePrefix<2ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
               (tuple<testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                *matchers,
               tuple<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
               *values,ostream *os)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  _Head_base<1UL,_int,_false> *x;
  type matcher;
  StringMatchResultListener listener;
  MatcherBase<int> local_1f8;
  long *local_1e0;
  long local_1d8;
  long local_1d0 [2];
  MatchResultListener local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  TuplePrefix<1ul>::
  ExplainMatchFailuresTo<std::tuple<testing::Matcher<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&>,testing::Matcher<int>,testing::Matcher<unsigned_int>>,std::tuple<std::unique_ptr<SDL_Surface,std::function<void(SDL_Surface*)>>const&,int,unsigned_int>>
            (matchers,values,os);
  local_1f8.vtable_ =
       (matchers->
       super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
       ).super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
       super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.super_MatcherBase<int>.
       vtable_;
  local_1f8.buffer_ =
       (Buffer)(matchers->
               super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
               ).super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
               super__Head_base<1UL,_testing::Matcher<int>,_false>._M_head_impl.
               super_MatcherBase<int>.buffer_.shared;
  if ((local_1f8.vtable_ != (VTable *)0x0) &&
     ((local_1f8.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
    LOCK();
    ((local_1f8.buffer_.shared)->ref).super___atomic_base<int>._M_i =
         ((local_1f8.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1f8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_0032a558;
  local_1c0.stream_ = local_1a0;
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0031e1a0;
  std::__cxx11::stringstream::stringstream(local_1b0);
  x = &(values->
       super__Tuple_impl<0UL,_const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&,_int,_unsigned_int>
       ).super__Tuple_impl<1UL,_int,_unsigned_int>.super__Head_base<1UL,_int,_false>;
  bVar1 = MatcherBase<int>::MatchAndExplain(&local_1f8,&x->_M_head_impl,&local_1c0);
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"  Expected arg #",0x10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    MatcherBase<int>::DescribeTo
              ((MatcherBase<int> *)
               &(matchers->
                super__Tuple_impl<0UL,_testing::Matcher<const_std::unique_ptr<SDL_Surface,_std::function<void_(SDL_Surface_*)>_>_&>,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>
                ).super__Tuple_impl<1UL,_testing::Matcher<int>,_testing::Matcher<unsigned_int>_>.
                super__Head_base<1UL,_testing::Matcher<int>,_false>,os);
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n           Actual: ",0x14);
    std::ostream::operator<<((ostream *)os,x->_M_head_impl);
    std::__cxx11::stringbuf::str();
    iVar2 = std::__cxx11::string::compare((char *)&local_1e0);
    if (iVar2 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1e0,local_1d8);
    }
    if (local_1e0 != local_1d0) {
      operator_delete(local_1e0,local_1d0[0] + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
  }
  local_1c0._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_0031e1a0;
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  MatcherBase<int>::~MatcherBase(&local_1f8);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename std::tuple_element<N - 1, MatcherTuple>::type matcher =
        std::get<N - 1>(matchers);
    typedef typename std::tuple_element<N - 1, ValueTuple>::type Value;
    const Value& value = std::get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      *os << "  Expected arg #" << N - 1 << ": ";
      std::get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }